

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_metadata.cc
# Opt level: O0

AttributeMetadata * __thiscall
draco::GeometryMetadata::GetAttributeMetadataByStringEntry
          (GeometryMetadata *this,string *entry_name,string *entry_value)

{
  bool bVar1;
  __type _Var2;
  long in_RDI;
  string value;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *att_metadata
  ;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  *__range1;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Metadata *in_stack_ffffffffffffff80;
  int local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
  local_30;
  long local_28;
  pointer local_8;
  
  local_28 = in_RDI + 0x60;
  local_30._M_current =
       (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> *)
       std::
       vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
       ::begin((vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::
  vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
  ::end((vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar1) {
      return (AttributeMetadata *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
    ::operator*(&local_30);
    in_stack_ffffffffffffff80 = (Metadata *)&stack0xffffffffffffffa0;
    std::__cxx11::string::string((string *)in_stack_ffffffffffffff80);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    operator->((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                *)0x1be7f2);
    bVar1 = Metadata::GetEntryString
                      (in_stack_ffffffffffffff80,
                       (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (string *)0x1be804);
    if (bVar1) {
      _Var2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (_Var2) {
        local_8 = std::
                  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  ::get((unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                         *)in_stack_ffffffffffffff80);
        local_70 = 1;
      }
      else {
        local_70 = 0;
      }
    }
    else {
      local_70 = 3;
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    if ((local_70 != 0) && (local_70 == 1)) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_*,_std::vector<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>_>
    ::operator++(&local_30);
    in_stack_ffffffffffffff7c = local_70;
  }
  return local_8;
}

Assistant:

const AttributeMetadata *GeometryMetadata::GetAttributeMetadataByStringEntry(
    const std::string &entry_name, const std::string &entry_value) const {
  for (auto &&att_metadata : att_metadatas_) {
    std::string value;
    if (!att_metadata->GetEntryString(entry_name, &value)) {
      continue;
    }
    if (value == entry_value) {
      return att_metadata.get();
    }
  }
  // No attribute has the requested entry.
  return nullptr;
}